

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

int N_VWrmsNormVectorArray(int nvec,N_Vector *X,N_Vector *W,realtype *nrm)

{
  _func_int_int_N_Vector_ptr_N_Vector_ptr_realtype_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  realtype rVar4;
  
  UNRECOVERED_JUMPTABLE = (*X)->ops->nvwrmsnormvectorarray;
  if (UNRECOVERED_JUMPTABLE != (_func_int_int_N_Vector_ptr_N_Vector_ptr_realtype_ptr *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,X,W,nrm);
    return iVar1;
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)nvec;
  if (nvec < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    rVar4 = (*(*X)->ops->nvwrmsnorm)(X[uVar3],W[uVar3]);
    nrm[uVar3] = rVar4;
  }
  return 0;
}

Assistant:

int N_VWrmsNormVectorArray(int nvec, N_Vector* X, N_Vector* W, realtype* nrm)
{
  int i, ier;

  if (X[0]->ops->nvwrmsnormvectorarray != NULL) {
    
    ier = X[0]->ops->nvwrmsnormvectorarray(nvec, X, W, nrm);
    return(ier);

  } else {

    for (i=0; i<nvec; i++) {
      nrm[i] = X[0]->ops->nvwrmsnorm(X[i], W[i]);
    }
    return(0);

  }
}